

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleCameraNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  pointer ppaVar1;
  aiCamera *this_00;
  aiNode *this_01;
  aiCamera *camera;
  aiCamera *local_30;
  
  this_00 = (aiCamera *)operator_new(0x438);
  aiCamera::aiCamera(this_00);
  local_30 = this_00;
  std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back(&this->m_cameraCache,&local_30);
  this->m_currentCamera = local_30;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  pushNode(this,this_01,pScene);
  this->m_tokenType = 6;
  this->m_currentNode = this_01;
  handleNodes(this,node,pScene);
  ppaVar1 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppaVar1) {
    (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar1 + -1;
  }
  aiString::Set(&this->m_currentCamera->mName,(this_01->mName).data);
  return;
}

Assistant:

void OpenGEXImporter::handleCameraNode( DDLNode *node, aiScene *pScene ) {
    aiCamera *camera( new aiCamera );
    m_cameraCache.push_back( camera );
    m_currentCamera = camera;

    aiNode *newNode = new aiNode;
    pushNode( newNode, pScene );
    m_tokenType = Grammar::CameraNodeToken;
    m_currentNode = newNode;

    handleNodes( node, pScene );

    popNode();

    m_currentCamera->mName.Set( newNode->mName.C_Str() );
}